

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

char * varinfo(lua_State *L,TValue *o)

{
  CallInfo *ci;
  lua_CFunction p_Var1;
  StkId pTVar2;
  Proto *p;
  int lastpc;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  char *local_28;
  
  local_28 = (char *)0x0;
  ci = L->ci;
  if ((ci->callstatus & 2) == 0) {
LAB_00115a6a:
    return "";
  }
  if (ci->func->tt_ == 0x8006) {
    p_Var1 = (ci->func->value_).f;
    if (p_Var1[8] == (_func_int_lua_State_ptr)0x6) {
      for (uVar6 = 0; (byte)p_Var1[10] != uVar6; uVar6 = uVar6 + 1) {
        if ((TValue *)**(long **)(p_Var1 + uVar6 * 8 + 0x20) == o) {
          pcVar3 = upvalname(*(Proto **)(p_Var1 + 0x18),(int)uVar6);
          pcVar5 = "upvalue";
          goto LAB_00115b1a;
        }
      }
      pTVar2 = (ci->u).l.base;
      lVar4 = (long)o - (long)pTVar2;
      if ((-1 < lVar4) && (lVar4 < (long)ci->top - (long)pTVar2)) {
        p = *(Proto **)(p_Var1 + 0x18);
        lastpc = currentpc(ci);
        pcVar5 = getobjname(p,lastpc,(int)((ulong)((long)o - (long)(ci->u).l.base) >> 4),&local_28);
        pcVar3 = local_28;
        if (pcVar5 != (char *)0x0) {
LAB_00115b1a:
          pcVar3 = luaO_pushfstring(L," (%s \'%s\')",pcVar5,pcVar3);
          return pcVar3;
        }
      }
      goto LAB_00115a6a;
    }
    pcVar3 = "((((ci)->func)->value_).gc)->tt == ((6) | ((0) << 4))";
  }
  else {
    pcVar3 = "(((((ci)->func))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))";
  }
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                ,0x25c,"const char *getupvalname(CallInfo *, const TValue *, const char **)");
}

Assistant:

static const char *varinfo (lua_State *L, const TValue *o) {
  const char *name = NULL;  /* to avoid warnings */
  CallInfo *ci = L->ci;
  const char *kind = NULL;
  if (isLua(ci)) {
    kind = getupvalname(ci, o, &name);  /* check whether 'o' is an upvalue */
    if (!kind && isinstack(ci, o))  /* no? try a register */
      kind = getobjname(ci_func(ci)->p, currentpc(ci),
                        cast_int(o - ci->u.l.base), &name);
  }
  return (kind) ? luaO_pushfstring(L, " (%s '%s')", kind, name) : "";
}